

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

string * __thiscall google::protobuf::MessageLite::SerializeAsString_abi_cxx11_(MessageLite *this)

{
  bool bVar1;
  string *in_RDI;
  string *output;
  string *in_stack_00000048;
  MessageLite *in_stack_00000050;
  
  std::__cxx11::string::string((string *)in_RDI);
  bVar1 = AppendToString(in_stack_00000050,in_stack_00000048);
  if (!bVar1) {
    std::__cxx11::string::clear();
  }
  return in_RDI;
}

Assistant:

std::string MessageLite::SerializeAsString() const {
  // If the compiler implements the (Named) Return Value Optimization,
  // the local variable 'output' will not actually reside on the stack
  // of this function, but will be overlaid with the object that the
  // caller supplied for the return value to be constructed in.
  std::string output;
  if (!AppendToString(&output)) output.clear();
  return output;
}